

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

optional<unsigned_int> __thiscall
slang::ast::ConditionalExpression::getEffectiveWidthImpl(ConditionalExpression *this)

{
  Expression *pEVar1;
  optional<unsigned_int> *poVar2;
  _Optional_base<unsigned_int,_true,_true> local_28;
  _Optional_payload_base<unsigned_int> local_20;
  ConditionalExpression *local_18;
  ConditionalExpression *this_local;
  
  local_18 = this;
  pEVar1 = left(this);
  local_20 = (_Optional_payload_base<unsigned_int>)Expression::getEffectiveWidth(pEVar1);
  pEVar1 = right(this);
  local_28._M_payload.super__Optional_payload_base<unsigned_int> =
       (_Optional_payload<unsigned_int,_true,_true,_true>)Expression::getEffectiveWidth(pEVar1);
  poVar2 = std::max<std::optional<unsigned_int>>
                     ((optional<unsigned_int> *)&local_20,(optional<unsigned_int> *)&local_28);
  return (optional<unsigned_int>)
         (poVar2->super__Optional_base<unsigned_int,_true,_true>)._M_payload.
         super__Optional_payload_base<unsigned_int>;
}

Assistant:

std::optional<bitwidth_t> ConditionalExpression::getEffectiveWidthImpl() const {
    return std::max(left().getEffectiveWidth(), right().getEffectiveWidth());
}